

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.h
# Opt level: O2

void __thiscall sptk::MedianFilter::~MedianFilter(MedianFilter *this)

{
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__MedianFilter_00111c50;
  std::
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~deque(&this->queue_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->flat_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->buffer_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

~MedianFilter() override {
  }